

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
               *this,raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
                     *that)

{
  char *pcVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  size_t *psVar4;
  undefined8 *in_RDI;
  HashtablezInfoHandle *in_stack_ffffffffffffff78;
  unsigned_long **in_stack_ffffffffffffff80;
  HashtablezInfoHandle *obj;
  
  EmptyGroup();
  pcVar1 = exchange<signed_char*,signed_char*>
                     ((char **)in_stack_ffffffffffffff80,(char **)in_stack_ffffffffffffff78);
  *in_RDI = pcVar1;
  puVar2 = exchange<unsigned_long*,decltype(nullptr)>
                     (in_stack_ffffffffffffff80,(void **)in_stack_ffffffffffffff78);
  in_RDI[1] = puVar2;
  uVar3 = exchange<unsigned_long,int>
                    ((unsigned_long *)in_stack_ffffffffffffff80,(int *)in_stack_ffffffffffffff78);
  in_RDI[2] = uVar3;
  obj = (HashtablezInfoHandle *)(in_RDI + 3);
  uVar3 = exchange<unsigned_long,int>((unsigned_long *)obj,(int *)in_stack_ffffffffffffff78);
  *(unsigned_long *)obj = uVar3;
  exchange<phmap::priv::HashtablezInfoHandle,phmap::priv::HashtablezInfoHandle>
            (obj,in_stack_ffffffffffffff78);
  CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  ::CompressedTuple((CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)obj,(CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)in_stack_ffffffffffffff78);
  psVar4 = growth_left((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)0x1906eb);
  *psVar4 = 0;
  return;
}

Assistant:

raw_hash_set(raw_hash_set&& that) noexcept(
			    std::is_nothrow_copy_constructible<hasher>::value&&
			    std::is_nothrow_copy_constructible<key_equal>::value&&
			    std::is_nothrow_copy_constructible<allocator_type>::value)
				: ctrl_(phmap::exchange(that.ctrl_, EmptyGroup())),
				  slots_(phmap::exchange(that.slots_, nullptr)),
				  size_(phmap::exchange(that.size_, 0)),
				  capacity_(phmap::exchange(that.capacity_, 0)),
				  infoz_(phmap::exchange(that.infoz_, HashtablezInfoHandle())),
				  // Hash, equality and allocator are copied instead of moved because
				  // `that` must be left valid. If Hash is std::function<Key>, moving it
				  // would create a nullptr functor that cannot be called.
				  settings_(std::move(that.settings_))
			{
				// growth_left was copied above, reset the one from `that`.
				that.growth_left() = 0;
			}